

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpCommonStringsToFile
          (GeneralizedSuffixTree *this,string *filename)

{
  uint uVar1;
  FILE *__stream;
  bool bVar2;
  size_type sVar3;
  char *__filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  reference pvVar4;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *this_00;
  reference pvVar5;
  long lVar6;
  undefined8 uVar7;
  float local_154;
  float local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  reference local_d0;
  pair<const_unsigned_int,_SuffixTree::Edge> *edge_pair;
  iterator __end4;
  iterator __begin4;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *__range4;
  Node *cur_node;
  uint i;
  uint cur_max;
  string ans;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  FILE *local_48;
  FILE *file;
  void *local_38;
  pair<SuffixTree::Node_*,_unsigned_int> local_30;
  value_type local_20;
  string *local_18;
  string *filename_local;
  GeneralizedSuffixTree *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  printf("Finding common substrings...\n");
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->strings);
  local_20 = (value_type)0x0;
  std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::resize
            (&this->previous_suffixes,sVar3,&local_20);
  ProcessLCAQueries(this,this->root);
  CalculateNumLeavesNumLCA(this,this->root);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->strings);
  local_38 = (void *)0x0;
  file._4_4_ = 0;
  std::pair<SuffixTree::Node_*,_unsigned_int>::pair<std::nullptr_t,_int,_true>
            (&local_30,&local_38,(int *)((long)&file + 4));
  std::
  vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  ::resize(&this->answers,sVar3,&local_30);
  FindAnswers(this,this->root,0);
  printf("Common substrings were found\n");
  __filename = (char *)std::__cxx11::string::c_str();
  local_48 = fopen(__filename,"w");
  if (local_48 == (FILE *)0x0) {
    ans.field_2._M_local_buf[0xb] = '\x01';
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Can not open file: ",&local_69);
    std::operator+(__return_storage_ptr__,&local_68,filename);
    ans.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  std::__cxx11::string::string((string *)&i);
  cur_node._4_4_ = 0;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->strings);
  uVar1 = (uint)sVar3;
  do {
    cur_node._0_4_ = uVar1 - 1;
    if ((uint)cur_node == 0) {
      fclose(local_48);
      printf("\rSubstrings were written successfully\n");
      std::__cxx11::string::~string((string *)&i);
      return;
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->strings);
    local_14c = (float)(sVar3 - (uint)cur_node);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->strings);
    local_154 = (float)sVar3;
    printf("\rWriting substrings to file: %.2f %%",(double)((local_14c * 100.0) / local_154));
    fprintf(local_48,"%u common substrings: ",(ulong)uVar1);
    pvVar4 = std::
             vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
             ::operator[](&this->answers,(ulong)(uint)cur_node);
    if (cur_node._4_4_ < pvVar4->second) {
      pvVar4 = std::
               vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
               ::operator[](&this->answers,(ulong)(uint)cur_node);
      cur_node._4_4_ = pvVar4->second;
      std::__cxx11::string::clear();
      pvVar4 = std::
               vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
               ::operator[](&this->answers,(ulong)(uint)cur_node);
      for (__range4 = (unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                       *)pvVar4->first; (__range4->_M_h)._M_buckets != (__buckets_ptr)0x0;
          __range4 = (unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                      *)(__range4->_M_h)._M_buckets) {
        this_00 = (unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                   *)((__range4->_M_h)._M_buckets + 5);
        __end4 = std::
                 unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                 ::begin(this_00);
        edge_pair = (pair<const_unsigned_int,_SuffixTree::Edge> *)
                    std::
                    unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                    ::end(this_00);
        while (bVar2 = std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                                    *)&edge_pair), bVar2) {
          local_d0 = std::__detail::
                     _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
                     operator*(&__end4);
          if ((local_d0->second).field_0.node == (Node *)__range4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&this->strings,(ulong)(local_d0->second).string_number);
            std::__cxx11::string::substr((ulong)&local_110,(ulong)pvVar5);
            std::operator+(&local_f0,&local_110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
            std::__cxx11::string::operator=((string *)&i,(string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_110);
            break;
          }
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::operator++
                    (&__end4);
        }
      }
    }
    lVar6 = std::__cxx11::string::size();
    __stream = local_48;
    uVar1 = (uint)cur_node;
    if (lVar6 == 0) {
      fprintf(local_48,"<Empty string>\n");
    }
    else {
      uVar7 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s\n",uVar7);
    }
  } while( true );
}

Assistant:

void GeneralizedSuffixTree::DumpCommonStringsToFile (std::string filename)
{
    printf ("Finding common substrings...\n");
    // process lca_queries
    previous_suffixes.resize (strings.size(), nullptr);
    ProcessLCAQueries (root);
    // calculate number of leaves and least common ancestors
    CalculateNumLeavesNumLCA (root);
    // find answers for all numbers of substrings
    answers.resize (strings.size(), std::pair<Node *, uint> (nullptr, 0));
    FindAnswers (root, 0);
    printf ("Common substrings were found\n");
    // write to file
    FILE *file = fopen (filename.c_str(), "w");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    std::string ans;
    uint cur_max = 0;
    for (uint i = strings.size() - 1; i > 0; --i)
    {
        printf ("\rWriting substrings to file: %.2f %%", (strings.size() - i) * 100.0f / strings.size());
        fprintf (file, "%u common substrings: ", i + 1);
        if (answers[i].second > cur_max)
        {
            cur_max = answers[i].second;
            ans.clear();
            Node *cur_node = answers[i].first;
            while (cur_node->parent)
            {
                for (const auto &edge_pair : cur_node->parent->edges)
                    if (edge_pair.second.node == cur_node)
                    {
                        ans = strings[edge_pair.second.string_number].substr (edge_pair.second.start,
                                edge_pair.second.length) + ans;
                        break;
                    }
                cur_node  = cur_node->parent;
            }
        }
        if (ans.size())
            fprintf (file, "%s\n", ans.c_str());
        else
            fprintf (file, "<Empty string>\n");
    }
    fclose (file);
    printf ("\rSubstrings were written successfully\n");
}